

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_HRR_Writer.cpp
# Opt level: O1

void __thiscall OSTEI_HRR_Writer::WriteHRR_Ket_External_(OSTEI_HRR_Writer *this,ostream *os,QAM *am)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  int iVar3;
  OSTEI_HRR_Algorithm_Base *pOVar4;
  _Type aiVar5;
  pointer pcVar6;
  undefined8 uVar7;
  RRStepType step;
  ostream *poVar8;
  _Rb_tree_node_base *p_Var9;
  long lVar10;
  int iVar11;
  uint uVar12;
  undefined1 *local_1f8;
  undefined8 local_1f0;
  undefined1 local_1e8;
  undefined7 uStack_1e7;
  undefined8 uStack_1e0;
  undefined1 local_1d8 [32];
  undefined1 local_1b8;
  undefined7 uStack_1b7;
  undefined8 uStack_1b0;
  undefined1 local_1a0 [48];
  undefined1 *local_170;
  undefined8 local_168;
  undefined1 local_160 [8];
  undefined8 uStack_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_150;
  size_type local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_130;
  size_type local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  string local_110;
  string local_f0;
  undefined8 local_d0;
  undefined1 *local_c8;
  undefined8 local_c0;
  undefined1 local_b8 [8];
  undefined8 uStack_b0;
  DAM local_a8;
  DAM local_80;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pOVar4 = this->hrr_algo_;
  aiVar5 = *(_Type *)((am->qam)._M_elems + 2);
  local_130 = &local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"");
  paVar1 = &local_80.tag.field_2;
  if (local_130 == &local_120) {
    local_80.tag.field_2._8_8_ = local_120._8_8_;
    local_80.tag._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_80.tag._M_dataplus._M_p = (pointer)local_130;
  }
  local_80.tag._M_string_length = local_128;
  local_128 = 0;
  local_120._M_local_buf[0] = '\0';
  local_130 = &local_120;
  local_80.dam._M_elems = aiVar5;
  step = OSTEI_HRR_Algorithm_Base::GetKetRRStep(pOVar4,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.tag._M_dataplus._M_p != paVar1) {
    operator_delete(local_80.tag._M_dataplus._M_p);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,indent4_abi_cxx11_._M_dataplus._M_p,indent4_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"HRR_",4);
  RRStepTypeToStr_abi_cxx11_((string *)local_1a0,step);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,(char *)local_1a0._0_8_,local_1a0._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"_",1);
  local_1d8[0] = "spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789"
                 [(am->qam)._M_elems[2]];
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_1d8,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"_",1);
  local_1d8[0] = "spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789"
                 [(am->qam)._M_elems[3]];
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_1d8,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"(\n",2);
  pcVar2 = local_1a0 + 0x10;
  if ((char *)local_1a0._0_8_ != pcVar2) {
    operator_delete((void *)local_1a0._0_8_);
  }
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,indent5_abi_cxx11_._M_dataplus._M_p,indent5_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"",0);
  local_1a0._16_4_ = 0x525248;
  local_1a0._8_8_ = 3;
  local_1a0._0_8_ = pcVar2;
  ArrVarName((string *)local_1d8,am,(string *)local_1a0);
  if ((char *)local_1a0._0_8_ != pcVar2) {
    operator_delete((void *)local_1a0._0_8_);
  }
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,(char *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_),
                      CONCAT44(local_1d8._12_4_,local_1d8._8_4_));
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,",\n",2);
  if ((undefined1 *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_) != local_1d8 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_));
  }
  pOVar4 = this->hrr_algo_;
  aiVar5 = *(_Type *)((am->qam)._M_elems + 2);
  local_150 = &local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"");
  paVar1 = &local_a8.tag.field_2;
  if (local_150 == &local_140) {
    local_a8.tag.field_2._8_8_ = local_140._8_8_;
    local_a8.tag._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_a8.tag._M_dataplus._M_p = (pointer)local_150;
  }
  local_a8.tag._M_string_length = local_148;
  local_148 = 0;
  local_140._M_local_buf[0] = '\0';
  local_150 = &local_140;
  local_a8.dam._M_elems = aiVar5;
  OSTEI_HRR_Algorithm_Base::GetKetAMReq((DAMSet *)local_1a0,pOVar4,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.tag._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8.tag._M_dataplus._M_p);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if ((_Rb_tree_node_base *)local_1a0._24_8_ != (_Rb_tree_node_base *)(local_1a0 + 8)) {
    p_Var9 = (_Rb_tree_node_base *)local_1a0._24_8_;
    do {
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,indent5_abi_cxx11_._M_dataplus._M_p,indent5_abi_cxx11_._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"",0);
      local_48 = *(undefined8 *)(am->qam)._M_elems;
      uStack_40 = 0;
      local_58 = *(undefined8 *)(p_Var9 + 1);
      uStack_50 = 0;
      pcVar6 = (am->tag)._M_dataplus._M_p;
      local_1f8 = &local_1e8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1f8,pcVar6,pcVar6 + (am->tag)._M_string_length);
      local_1d8._8_4_ = (undefined4)local_58;
      local_1d8._12_4_ = (undefined4)((ulong)local_58 >> 0x20);
      local_1d8._0_4_ = (int)local_48;
      local_1d8._4_4_ = local_48._4_4_;
      if (local_1f8 == &local_1e8) {
        uStack_1b0 = uStack_1e0;
        local_1d8._16_8_ = &local_1b8;
      }
      else {
        local_1d8._16_8_ = local_1f8;
      }
      uStack_1b7 = uStack_1e7;
      local_1b8 = local_1e8;
      local_1d8._24_8_ = local_1f0;
      local_1f0 = 0;
      local_1e8 = 0;
      local_f0.field_2._M_local_buf[2] = 'R';
      local_f0.field_2._M_allocated_capacity._0_2_ = 0x5248;
      local_f0._M_string_length = 3;
      local_f0.field_2._M_local_buf[3] = '\0';
      local_1f8 = &local_1e8;
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      ArrVarName(&local_110,(QAM *)local_1d8,&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,local_110._M_dataplus._M_p,local_110._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,",\n",2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p);
      }
      if ((undefined1 *)local_1d8._16_8_ != &local_1b8) {
        operator_delete((void *)local_1d8._16_8_);
      }
      if (local_1f8 != &local_1e8) {
        operator_delete(local_1f8);
      }
      p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
    } while (p_Var9 != (_Rb_tree_node_base *)(local_1a0 + 8));
  }
  std::_Rb_tree<DAM,_DAM,_std::_Identity<DAM>,_std::less<DAM>,_std::allocator<DAM>_>::~_Rb_tree
            ((_Rb_tree<DAM,_DAM,_std::_Identity<DAM>,_std::less<DAM>,_std::allocator<DAM>_> *)
             local_1a0);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,indent5_abi_cxx11_._M_dataplus._M_p,indent5_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"hCD, ",5);
  uVar7 = *(undefined8 *)(am->qam)._M_elems;
  local_170 = local_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"");
  local_d0 = uVar7;
  if (local_170 == local_160) {
    uStack_b0 = uStack_158;
    local_c8 = local_b8;
  }
  else {
    local_c8 = local_170;
  }
  local_c0 = local_168;
  local_168 = 0;
  local_160[0] = 0;
  iVar11 = 1;
  lVar10 = 0;
  do {
    iVar3 = *(int *)((long)&local_d0 + lVar10);
    uVar12 = (uint)((iVar3 + 1) * (iVar3 + 2)) >> 1;
    if (iVar3 < 0) {
      uVar12 = 0;
    }
    iVar11 = iVar11 * uVar12;
    lVar10 = lVar10 + 4;
  } while (lVar10 != 8);
  local_170 = local_160;
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iVar11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,");\n",3);
  if (local_c8 != local_b8) {
    operator_delete(local_c8);
  }
  if (local_170 != local_160) {
    operator_delete(local_170);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"SIMINT EXTERNAL HRR ",0x14);
  RRStepTypeToStr_abi_cxx11_((string *)local_1a0,step);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_1a0._0_8_,local_1a0._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,(am->qam)._M_elems[2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,(am->qam)._M_elems[3]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
    operator_delete((void *)local_1a0._0_8_);
  }
  return;
}

Assistant:

void OSTEI_HRR_Writer::WriteHRR_Ket_External_(std::ostream & os, QAM am) const
{
    RRStepType rrstep = hrr_algo_.GetKetRRStep({am[2], am[3]});
    os << indent4 << "HRR_" << RRStepTypeToStr(rrstep) << "_"
       << amchar[am[2]] << "_" << amchar[am[3]] << "(\n";

    // pointer to result buffer
    os << indent5 << "" << HRRVarName(am) << ",\n";

    // pointer to requirements
    for(const auto & it : hrr_algo_.GetKetAMReq({am[2], am[3]}))
        os << indent5 << "" << HRRVarName({am[0], am[1], it[0], it[1], am.tag}) << ",\n";

    os << indent5 << "hCD, " << NCART(DAM{am[0], am[1]}) << ");\n";

    // Mark this as required in the log file
    std::cout << "SIMINT EXTERNAL HRR " << RRStepTypeToStr(rrstep)
              << " " << am[2] << " " << am[3] << "\n";
}